

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  cmFunctionBlocker *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  string *psVar9;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> tVar10;
  pointer pbVar11;
  int iVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  char cVar18;
  pointer pbVar19;
  undefined8 uVar20;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> _Var21;
  string *__x;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  anon_class_16_2_5155b745 __gen;
  string_view arg;
  int stop;
  int step;
  int cc;
  string __str;
  size_type __dnew;
  int local_108;
  int local_104;
  cmMakefile *local_100;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  undefined8 local_c0;
  long *local_b8;
  string local_b0;
  long *local_90;
  uint local_88;
  undefined4 uStack_84;
  long local_80 [2];
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 local_38;
  
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 == pbVar11) {
    local_f0._0_8_ = (long)local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_f0._0_8_ == (long)local_f0 + 0x10) {
      return false;
    }
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
    return false;
  }
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                    (pbVar19,pbVar11,"IN");
  this_01 = status->Makefile;
  if (_Var8._M_current !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_f8._M_head_impl = (cmFunctionBlocker *)operator_new(200);
    ((local_f8._M_head_impl)->StartingContext).Name._M_dataplus._M_p =
         (pointer)&((local_f8._M_head_impl)->StartingContext).Name.field_2;
    ((local_f8._M_head_impl)->StartingContext).Name._M_string_length = 0;
    ((local_f8._M_head_impl)->StartingContext).Name.field_2._M_local_buf[0] = '\0';
    ((local_f8._M_head_impl)->StartingContext).FilePath._M_dataplus._M_p =
         (pointer)&((local_f8._M_head_impl)->StartingContext).FilePath.field_2;
    ((local_f8._M_head_impl)->StartingContext).FilePath._M_string_length = 0;
    ((local_f8._M_head_impl)->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
    ((local_f8._M_head_impl)->StartingContext).Line = 0;
    *(bool *)((long)&((local_f8._M_head_impl)->StartingContext).DeferId.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x20) = false;
    ((local_f8._M_head_impl)->Functions).
    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_f8._M_head_impl)->Functions).
    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_f8._M_head_impl)->Functions).
    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_f8._M_head_impl)->ScopeDepth = 1;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(local_f8._M_head_impl)->_vptr_cmFunctionBlocker)->_M_allocated_capacity =
         (size_type)&PTR__cmForEachFunctionBlocker_0094f200;
    this = local_f8._M_head_impl + 1;
    local_f8._M_head_impl[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
    local_f8._M_head_impl[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_head_impl[1].StartingContext.Name._M_string_length = 0;
    local_f8._M_head_impl[1].StartingContext.Name.field_2._M_allocated_capacity = (size_type)this_01
    ;
    *(undefined8 *)((long)&local_f8._M_head_impl[1].StartingContext.Name.field_2 + 8) = 0;
    *(undefined1 *)&local_f8._M_head_impl[1].StartingContext.FilePath._M_dataplus._M_p = 0;
    local_100 = this_01;
    cmMakefile::PushLoopBlock(this_01);
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (long)_Var8._M_current - (long)pbVar19 >> 5;
    if (0 < lVar16) {
      uVar17 = lVar16 + 1;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,pbVar19);
        pbVar19 = pbVar19 + 1;
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
    }
    lVar16 = (long)(((cmListFileContext *)((long)local_f8._M_head_impl + 0xa0))->Name)._M_dataplus.
                   _M_p - (long)(local_f8._M_head_impl + 0x98)->_vptr_cmFunctionBlocker;
    *(long *)((long)local_f8._M_head_impl + 0xb8) = lVar16 >> 5;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __x = _Var8._M_current + 1;
    if (__x != pbVar1) {
      uVar15 = 0;
      local_38 = lVar16 >> 5;
      do {
        iVar6 = std::__cxx11::string::compare((char *)__x);
        if (iVar6 == 0) {
          if (uVar15 == 3) {
            local_f0._0_8_ = (long)local_f0 + 0x10;
            local_68._M_allocated_capacity = 0x2d;
            local_f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)&local_68);
            local_e0._0_8_ = local_68._M_allocated_capacity;
            builtin_strncpy((char *)(local_f0._0_8_ + 0x1d),"h LISTS ",8);
            builtin_strncpy((char *)(local_f0._0_8_ + 0x25),"or ITEMS",8);
            *(undefined8 *)(local_f0._0_8_ + 0x10) = 0x6573752065622074;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_f0._0_8_ + 0x18))->_M_allocated_capacity = 0x4c20687469772064;
            *(undefined8 *)local_f0._0_8_ = 0x5453494c5f50495a;
            (((cmListFileContext *)(local_f0._0_8_ + 8))->Name)._M_dataplus._M_p =
                 (pointer)0x6f6e206e61632053;
            local_f0._8_8_ = local_68._M_allocated_capacity;
            *(char *)(local_f0._0_8_ + local_68._M_allocated_capacity) = '\0';
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)local_f0);
          }
          else {
            uVar15 = 1;
            if (lVar16 == 0x20) goto LAB_00374049;
            local_f0._0_8_ = (long)local_f0 + 0x10;
            local_68._M_allocated_capacity = 0x35;
            local_f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)&local_68);
            local_e0._0_8_ = local_68._M_allocated_capacity;
            *(undefined8 *)(local_f0._0_8_ + 0x20) = 0x617265746920656e;
            (((string *)(local_f0._0_8_ + 0x28))->_M_dataplus)._M_p = (pointer)0x726176206e6f6974;
            *(undefined8 *)(local_f0._0_8_ + 0x10) = 0x6520657269757165;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_f0._0_8_ + 0x18))->_M_allocated_capacity = 0x6f20796c74636178;
            *(undefined8 *)local_f0._0_8_ = 0x726f20534d455449;
            (((cmListFileContext *)(local_f0._0_8_ + 8))->Name)._M_dataplus._M_p =
                 (pointer)0x7220535453494c20;
            builtin_strncpy((char *)(local_f0._0_8_ + 0x2d),"variable",8);
            local_f0._8_8_ = local_68._M_allocated_capacity;
            *(char *)(local_f0._0_8_ + local_68._M_allocated_capacity) = '\0';
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)local_f0);
          }
LAB_0037451f:
          local_58 = local_e0._0_8_;
          uVar20 = local_f0._0_8_;
          _Var21._M_head_impl = local_f8._M_head_impl;
          if ((cmFunctionBlocker *)local_f0._0_8_ != (cmFunctionBlocker *)(local_f0 + 0x10))
          goto LAB_0037452e;
          goto LAB_0037453b;
        }
        iVar6 = std::__cxx11::string::compare((char *)__x);
        if (iVar6 == 0) {
          if (uVar15 == 3) {
            local_f0._0_8_ = (long)local_f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"ZIP_LISTS can not be used with LISTS or ITEMS","");
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)local_f0);
          }
          else {
            uVar15 = 2;
            if (lVar16 == 0x20) goto LAB_00374049;
            local_f0._0_8_ = (long)local_f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"ITEMS or LISTS require exactly one iteration variable",""
                      );
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)local_f0);
          }
          goto LAB_0037451f;
        }
        iVar6 = std::__cxx11::string::compare((char *)__x);
        if (iVar6 == 0) {
          if (uVar15 != 0) {
            local_f0._0_8_ = (long)local_f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"ZIP_LISTS can not be used with LISTS or ITEMS","");
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)local_f0);
            goto LAB_0037451f;
          }
          *(undefined1 *)&local_f8._M_head_impl[1].StartingContext.FilePath._M_dataplus._M_p = 1;
          uVar15 = 3;
        }
        else if (uVar15 == 1) {
          psVar9 = cmMakefile::GetSafeDefinition(local_100,__x);
          if (psVar9->_M_string_length == 0) {
            uVar15 = 1;
          }
          else {
            uVar15 = 1;
            arg._M_str = (psVar9->_M_dataplus)._M_p;
            arg._M_len = psVar9->_M_string_length;
            cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this,true);
          }
        }
        else {
          if ((uVar15 & 0xfffffffe) != 2) {
            local_f0._0_8_ =
                 (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
                 0x12;
            local_f0._8_8_ = "Unknown argument:\n";
            local_e0._0_8_ = (cmFunctionBlocker *)0x2;
            local_e0._8_8_ = (long)"Resource spec file:\n\n  " + 0x15;
            local_e0._24_8_ = (__x->_M_dataplus)._M_p;
            local_e0._16_8_ = __x->_M_string_length;
            local_c0 = 1;
            local_b8 = (long *)0x787805;
            views._M_len = 4;
            views._M_array = (iterator)local_f0;
            cmCatViews_abi_cxx11_((string *)&local_68,views);
            cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)&local_68);
            uVar20 = local_68._M_allocated_capacity;
            _Var21._M_head_impl = local_f8._M_head_impl;
            if ((cmFunctionBlocker *)local_68._M_allocated_capacity !=
                (cmFunctionBlocker *)&stack0xffffffffffffffa8) goto LAB_0037452e;
            goto LAB_0037453b;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,__x);
        }
LAB_00374049:
        uVar20 = local_38;
        __x = __x + 1;
      } while (__x != pbVar1);
      if ((1 < (ulong)local_38 && uVar15 == 3) &&
         (lVar16 >> 4 !=
          (long)local_f8._M_head_impl[1].StartingContext.Name._M_dataplus._M_p -
          (long)local_f8._M_head_impl[1]._vptr_cmFunctionBlocker >> 5)) {
        cVar18 = '\x01';
        if (9 < (ulong)local_38) {
          uVar13 = local_38;
          cVar4 = '\x04';
          do {
            cVar18 = cVar4;
            if ((ulong)uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_00374753;
            }
            if ((ulong)uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_00374753;
            }
            if ((ulong)uVar13 < 10000) goto LAB_00374753;
            bVar5 = 99999 < (ulong)uVar13;
            uVar13 = (ulong)uVar13 / 10000;
            cVar4 = cVar18 + '\x04';
          } while (bVar5);
          cVar18 = cVar18 + '\x01';
        }
LAB_00374753:
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_b0,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar20);
        local_e0._8_8_ = local_b0._M_dataplus._M_p;
        uVar17 = ((long)local_f8._M_head_impl[1].StartingContext.Name._M_dataplus._M_p -
                  (long)local_f8._M_head_impl[1]._vptr_cmFunctionBlocker >> 5) - uVar20;
        cVar18 = '\x01';
        if (9 < uVar17) {
          uVar14 = uVar17;
          cVar4 = '\x04';
          do {
            cVar18 = cVar4;
            if (uVar14 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_003747f0;
            }
            if (uVar14 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_003747f0;
            }
            if (uVar14 < 10000) goto LAB_003747f0;
            bVar5 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            cVar4 = cVar18 + '\x04';
          } while (bVar5);
          cVar18 = cVar18 + '\x01';
        }
LAB_003747f0:
        local_90 = local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar17);
        local_f0._0_8_ =
             (__uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>)0x9;
        local_f0._8_8_ = "Expected ";
        local_e0._16_8_ = 0x1b;
        local_e0._24_8_ = " list variables, but given ";
        local_c0 = CONCAT44(uStack_84,local_88);
        local_b8 = local_90;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_f0;
        local_e0._0_8_ =
             (cmFunctionBlocker *)
             CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length);
        cmCatViews_abi_cxx11_((string *)&local_68,views_00);
        cmMakefile::IssueMessage(local_100,FATAL_ERROR,(string *)&local_68);
        if ((cmFunctionBlocker *)local_68._M_allocated_capacity !=
            (cmFunctionBlocker *)&stack0xffffffffffffffa8) {
          operator_delete((void *)local_68._M_allocated_capacity,
                          (ulong)((long)&((cmFunctionBlocker *)local_58)->_vptr_cmFunctionBlocker +
                                 1));
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        local_58 = local_b0.field_2._M_allocated_capacity;
        uVar20 = local_b0._M_dataplus._M_p;
        _Var21._M_head_impl = local_f8._M_head_impl;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_0037452e:
          operator_delete((void *)uVar20,
                          (ulong)((long)&((cmFunctionBlocker *)local_58)->_vptr_cmFunctionBlocker +
                                 1));
          _Var21._M_head_impl = local_f8._M_head_impl;
        }
        goto LAB_0037453b;
      }
    }
    local_f0._0_8_ = local_f8._M_head_impl;
    cmMakefile::AddFunctionBlocker
              (local_100,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)local_f0);
    _Var21._M_head_impl = (cmFunctionBlocker *)local_f0._0_8_;
    if ((_Head_base<0UL,_cmFunctionBlocker_*,_false>)local_f0._0_8_ ==
        (_Head_base<0UL,_cmFunctionBlocker_*,_false>)0x0) {
      return true;
    }
LAB_0037453b:
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(_Var21._M_head_impl)->_vptr_cmFunctionBlocker)->_M_allocated_capacity + 8))()
    ;
    return true;
  }
  tVar10.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
  super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
       operator_new(200);
  *(long **)((long)tVar10.
                   super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                   .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar10.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined1 *)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
  *(long **)((long)tVar10.
                   super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                   .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
       (long *)((long)tVar10.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined1 *)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined4 *)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
  *(undefined ***)
   tVar10.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
   super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       &PTR__cmForEachFunctionBlocker_0094f200;
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)tVar10.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98);
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) = 0;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
  *(cmMakefile **)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0) = this_01;
  *(long *)((long)tVar10.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined1 *)
   ((long)tVar10.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0) = 0;
  cmMakefile::PushLoopBlock(this_01);
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x21) ||
     (iVar6 = std::__cxx11::string::compare((char *)(pbVar19 + 1)), iVar6 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,args);
    goto LAB_003741c5;
  }
  local_90 = (long *)((ulong)local_90 & 0xffffffff00000000);
  local_108 = 0;
  local_104 = 0;
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar11 - (long)pbVar19 == 0x60) {
    bVar5 = anon_unknown.dwarf_1206125::TryParseInteger(status,pbVar19 + 2,&local_108);
    if (!bVar5) goto LAB_003746d4;
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pbVar11 - (long)pbVar19 == 0x80) {
    bVar5 = anon_unknown.dwarf_1206125::TryParseInteger(status,pbVar19 + 2,(int *)&local_90);
    if ((!bVar5) ||
       (bVar5 = anon_unknown.dwarf_1206125::TryParseInteger
                          (status,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 3,&local_108), !bVar5
       )) goto LAB_003746d4;
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pbVar11 - (long)pbVar19 == 0xa0) {
    bVar5 = anon_unknown.dwarf_1206125::TryParseInteger(status,pbVar19 + 2,(int *)&local_90);
    if (((!bVar5) ||
        (bVar5 = anon_unknown.dwarf_1206125::TryParseInteger
                           (status,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 3,&local_108),
        !bVar5)) ||
       (bVar5 = anon_unknown.dwarf_1206125::TryParseInteger
                          (status,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 4,&local_104), !bVar5
       )) goto LAB_003746d4;
    iVar6 = (int)local_90;
    if (local_104 == 0) goto LAB_003745fa;
LAB_0037461f:
    bVar5 = local_108 < iVar6;
    if (!bVar5 || local_104 < 1) goto LAB_00374630;
  }
  else {
    iVar6 = (int)local_90;
LAB_003745fa:
    if (iVar6 <= local_108) {
      local_104 = 1;
      goto LAB_0037461f;
    }
    local_104 = -1;
    bVar5 = true;
LAB_00374630:
    iVar3 = local_104;
    if (-1 < local_104 || local_108 <= iVar6) {
      iVar12 = iVar6 - local_108;
      iVar7 = -(iVar6 - local_108);
      if (local_108 <= iVar6) {
        iVar7 = 0;
      }
      iVar2 = -local_104;
      if (0 < local_104) {
        iVar2 = local_104;
      }
      if (!bVar5) {
        iVar12 = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(this_00,(ulong)(iVar7 / iVar2 + iVar12 / iVar2 + 2));
      std::__cxx11::string::_M_assign
                ((string *)
                 (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      local_f0._0_4_ = iVar6;
      __gen.step = iVar3;
      __gen.cc = (int *)local_f0;
      __gen._12_4_ = 0;
      std::
      generate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmForEachCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)((long)tVar10.
                                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl +
                           0x98) + 0x20),
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)tVar10.
                         super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                         .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0),
                 __gen);
LAB_003741c5:
      *(long *)((long)tVar10.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) = 1;
      local_70._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           tVar10.
           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
           super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_70
                );
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_70._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_70._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
        return true;
      }
      return true;
    }
  }
  local_f0._0_8_ = (__uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>)0x31
  ;
  local_f0._8_8_ = "called with incorrect range specification: start ";
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_68,iVar6);
  cmStrCat<char[8],int,char[8],int>
            (&local_b0,(cmAlphaNum *)local_f0,(cmAlphaNum *)&local_68,(char (*) [8])", stop ",
             &local_108,(char (*) [8])", step ",&local_104);
  std::__cxx11::string::_M_assign((string *)&status->Error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  cmSystemTools::s_FatalErrorOccurred = true;
LAB_003746d4:
  (**(code **)(*(long *)tVar10.
                        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                        .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
            (tVar10.
             super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
             super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl);
  return false;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}